

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseInlineQueryResultCachedDocument_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::InlineQueryResultCachedDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::InlineQueryResultCachedDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"document_file_id",&local_59);
    peVar2 = std::
             __shared_ptr_access<TgBot::InlineQueryResultCachedDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_58,&peVar2->documentFileId);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"description",&local_81);
    peVar2 = std::
             __shared_ptr_access<TgBot::InlineQueryResultCachedDocument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_80,&peVar2->description);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TgTypeParser::parseInlineQueryResultCachedDocument(const InlineQueryResultCachedDocument::Ptr& object) const {
    if (!object){
        return "";
    }
    // This function will be called by parseInlineQueryResult(), so I don't add
    // curly brackets to the result string.
    string result;
    appendToJson(result, "document_file_id", object->documentFileId);
    appendToJson(result, "description", object->description);
    // The last comma will be erased by parseInlineQueryResult().
    return result;
}